

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O1

bool __thiscall
RootIndexProxyModel::insertColumns
          (RootIndexProxyModel *this,int column,int count,QModelIndex *parent)

{
  undefined1 uVar1;
  long lVar2;
  long *plVar3;
  QModelIndex local_38;
  
  lVar2 = QAbstractProxyModel::sourceModel();
  if (lVar2 == 0) {
    uVar1 = 0;
  }
  else {
    local_38.r = -1;
    local_38.c = -1;
    local_38.i = 0;
    local_38.m = (QAbstractItemModel *)0x0;
    if (((parent->r < 0) || (parent->c < 0)) || (parent->m == (QAbstractItemModel *)0x0)) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_38,&this->m_dptr->m_rootIndex);
    }
    else {
      (**(code **)(*(long *)this + 400))(&local_38,this,parent);
    }
    plVar3 = (long *)QAbstractProxyModel::sourceModel();
    uVar1 = (**(code **)(*plVar3 + 0x100))(plVar3,column,count,&local_38);
  }
  return (bool)uVar1;
}

Assistant:

bool RootIndexProxyModel::insertColumns(int column, int count, const QModelIndex &parent)
{
    Q_ASSERT(!parent.isValid() || parent.model() == this);
    if (!sourceModel())
        return 0;
    Q_D(RootIndexProxyModel);
    QModelIndex sourceParent;
    if (parent.isValid())
        sourceParent = mapToSource(parent);
    else
        sourceParent = d->m_rootIndex;
    return sourceModel()->insertColumns(column, count, sourceParent);
}